

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_parser.cpp
# Opt level: O2

void embree::emitXML(FileName *fileName,Ref<embree::XML> *xml)

{
  char cVar1;
  runtime_error *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  ofstream cout;
  
  std::ofstream::ofstream(&cout,(fileName->filename)._M_dataplus._M_p,_S_out);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 != '\0') {
    emitXML((ostream *)&cout,xml,0);
    std::ofstream::close();
    std::ofstream::~ofstream(&cout);
    return;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string((string *)&bStack_278,(string *)fileName);
  std::operator+(&local_258,"cannot open file ",&bStack_278);
  std::operator+(&local_238,&local_258," for writing");
  std::runtime_error::runtime_error(this,(string *)&local_238);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void emitXML(const FileName& fileName, const Ref<XML>& xml)
  {
    std::ofstream cout(fileName.c_str());
    if (!cout.is_open()) THROW_RUNTIME_ERROR("cannot open file " + fileName.str() + " for writing");
    emitXML(cout,xml);
    cout.close();
  }